

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void example1(string *fileName)

{
  vector<int,_std::allocator<int>_> *__n;
  void *__buf;
  vector<int,_std::allocator<int>_> corY;
  vector<int,_std::allocator<int>_> corX;
  undefined1 local_338 [24];
  undefined4 uStack_320;
  undefined4 local_31c;
  undefined4 uStack_318;
  undefined8 uStack_314;
  undefined1 local_30c [68];
  gdsSTR fooSTR;
  gdscpp fooGDS;
  gdsSTR local_110;
  
  __n = &corY;
  gdscpp::gdscpp(&fooGDS);
  gdsSTR::gdsSTR(&fooSTR);
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  corX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&fooSTR);
  local_338._0_4_ = 0;
  local_338._4_4_ = 200;
  local_338._8_4_ = 400;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corX,local_338);
  local_338._0_4_ = 700;
  local_338._4_4_ = 900;
  local_338._8_4_ = 700;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corY,local_338);
  drawPath((gdsPATH *)local_338,1,5,&corX,&corY);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::emplace_back<gdsPATH>
            (&fooSTR.PATH,(gdsPATH *)local_338);
  gdsPATH::~gdsPATH((gdsPATH *)local_338);
  local_338._0_4_ = 200;
  local_338._4_4_ = 200;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corX,local_338,local_338 + 8);
  local_338._0_4_ = 900;
  local_338._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corY,local_338);
  drawPath((gdsPATH *)local_338,1,5,&corX,&corY);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::emplace_back<gdsPATH>
            (&fooSTR.PATH,(gdsPATH *)local_338);
  gdsPATH::~gdsPATH((gdsPATH *)local_338);
  uStack_318 = 400;
  uStack_314 = 0;
  local_338._16_8_ = (pointer)0x96000000fa;
  uStack_320 = 0x96;
  local_31c = 400;
  local_338._0_4_ = 0;
  local_338._4_4_ = 0x96;
  local_338._8_4_ = 0x96;
  local_338._12_4_ = 0xfa;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corX,local_338,local_30c);
  uStack_318 = 400;
  uStack_314 = 400;
  local_338._16_8_ = (pointer)0x9600000096;
  uStack_320 = 0;
  local_31c = 0;
  local_338._0_4_ = 0;
  local_338._4_4_ = 0;
  local_338._8_4_ = 0xfa;
  local_338._12_4_ = 0xfa;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&corY,local_338);
  drawBoundary((gdsBOUNDARY *)local_338,2,&corX,&corY);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
            (&fooSTR.BOUNDARY,(gdsBOUNDARY *)local_338);
  gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_338);
  gdsSTR::gdsSTR(&local_110,&fooSTR);
  gdscpp::setSTR(&fooGDS,&local_110);
  gdsSTR::~gdsSTR(&local_110);
  gdscpp::write(&fooGDS,(int)fileName,__buf,(size_t)__n);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&corY.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&corX.super__Vector_base<int,_std::allocator<int>_>);
  gdsSTR::~gdsSTR(&fooSTR);
  gdscpp::~gdscpp(&fooGDS);
  return;
}

Assistant:

void example1(const string &fileName)
{
  gdscpp fooGDS;
  gdsSTR fooSTR;

  vector<int> corX;
  vector<int> corY;

  fooSTR.name = "arrow_box";

  corX = {000, 200, 400};
  corY = {700, 900, 700};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {200, 200};
  corY = {900, 000};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {0, 150, 150, 250, 250, 150, 150, 400, 400, 000, 0};
  corY = {0, 000, 250, 250, 150, 150, 000, 000, 400, 400, 0};
  fooSTR.BOUNDARY.push_back(drawBoundary(2, corX, corY));

  fooGDS.setSTR(fooSTR);
  fooGDS.write(fileName);
}